

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,OptionCallback *target,string_view param_2,
          string_view value)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  long lVar2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar3;
  string_view value_00;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_58;
  
  local_58.data_ = (pointer)local_58.firstElement;
  local_58.len = 0;
  local_58.cap = 2;
  value_00._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  value_00._M_len = (size_t)value._M_str;
  value_00._M_str._4_4_ = 0;
  sVar3 = parseList((slang *)value._M_len,value_00,SUB81(&local_58,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    param_2._M_str);
  pbVar1 = sVar3._M_ptr;
  for (lVar2 = sVar3._M_extent._M_extent_value._M_extent_value << 4; lVar2 != 0;
      lVar2 = lVar2 + -0x10) {
    value._M_str = (char *)target;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(__return_storage_ptr__,target,*pbVar1);
    if (__return_storage_ptr__->_M_string_length != 0) goto LAB_001c3c51;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    pbVar1 = pbVar1 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_001c3c51:
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (&local_58,(EVP_PKEY_CTX *)value._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(OptionCallback& target, std::string_view,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        auto result = target(entry);
        if (!result.empty())
            return result;
    }
    return {};
}